

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyjson.h
# Opt level: O3

bool tinyjson::atod(char *s,char *s_end,double *result)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  char cVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  byte *pbVar9;
  double dVar10;
  double dVar11;
  
  if (s_end <= s) {
LAB_00102c4f:
    iVar8 = 0;
    goto LAB_00102c52;
  }
  cVar5 = *s;
  if ((cVar5 == '-') || (cVar5 == '+')) {
    s = s + 1;
    if (s == s_end) goto LAB_00102a60;
    dVar11 = 0.0;
    if (*s == 0x2e) {
LAB_00102ae8:
      if ((byte *)s + 1 != (byte *)s_end) {
        uVar6 = 1;
        iVar7 = -1;
        do {
          uVar3 = (uint)(char)((byte *)s)[uVar6];
          if (9 < uVar3 - 0x30) {
            s = (char *)((byte *)s + uVar6);
            goto LAB_00102b7c;
          }
          if (uVar6 < 8) {
            dVar10 = atod::pow_lut[uVar6];
          }
          else {
            dVar10 = pow(10.0,(double)iVar7);
          }
          dVar11 = dVar11 + (double)(int)(uVar3 - 0x30) * dVar10;
          iVar7 = iVar7 + -1;
          lVar4 = uVar6 + 1;
          uVar6 = uVar6 + 1;
        } while ((byte *)s + lVar4 != (byte *)s_end);
      }
      goto LAB_00102c38;
    }
LAB_00102a69:
    dVar11 = 0.0;
    lVar4 = 0;
    do {
      if (9 < (int)(char)((byte *)s)[lVar4] - 0x30U) {
        if ((int)lVar4 == 0) goto LAB_00102c4f;
        s = (char *)((byte *)s + lVar4);
        goto LAB_00102ac9;
      }
      dVar11 = (double)(int)((int)(char)((byte *)s)[lVar4] - 0x30U) + dVar11 * 10.0;
      lVar2 = lVar4 + 1;
      lVar4 = lVar4 + 1;
    } while ((byte *)s + lVar2 != (byte *)s_end);
  }
  else {
    if ((int)cVar5 - 0x30U < 10) {
      cVar5 = '+';
LAB_00102a60:
      if (s == s_end) goto LAB_00102c4f;
      goto LAB_00102a69;
    }
    if (cVar5 != '.') goto LAB_00102c4f;
    dVar11 = 0.0;
    cVar5 = '+';
LAB_00102ac9:
    bVar1 = *s;
    uVar3 = (uint)bVar1;
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
LAB_00102b7c:
      if ((uVar3 & 0xff | 0x20) == 0x65) {
        pbVar9 = (byte *)s + 1;
        bVar1 = ((byte *)s)[1];
        if ((pbVar9 == (byte *)s_end) || ((bVar1 != 0x2d && (bVar1 != 0x2b)))) {
          iVar7 = 1;
          if (9 < (int)(char)bVar1 - 0x30U) goto LAB_00102c4f;
        }
        else {
          pbVar9 = (byte *)s + 2;
          iVar7 = (uint)(bVar1 == 0x2b) * 2 + -1;
        }
        iVar8 = 0;
        if (pbVar9 == (byte *)s_end) goto LAB_00102c52;
        lVar4 = 0;
        do {
          if (9 < (int)(char)pbVar9[lVar4] - 0x30U) {
            if ((int)lVar4 == 0) goto LAB_00102c4f;
            break;
          }
          iVar8 = ((int)(char)pbVar9[lVar4] - 0x30U) + iVar8 * 10;
          lVar2 = lVar4 + 1;
          lVar4 = lVar4 + 1;
        } while (pbVar9 + lVar2 != (byte *)s_end);
        if (iVar8 != 0) {
          dVar10 = pow(5.0,(double)(iVar8 * iVar7));
          dVar11 = ldexp(dVar10 * dVar11,iVar8 * iVar7);
        }
      }
    }
    else if (bVar1 == 0x2e) goto LAB_00102ae8;
  }
LAB_00102c38:
  if (cVar5 != '+') {
    dVar11 = -dVar11;
  }
  *result = dVar11;
  iVar8 = 1;
LAB_00102c52:
  return SUB41(iVar8,0);
}

Assistant:

static bool atod(const char *s, const char *s_end, double *result) {
    if (s >= s_end) {
      return false;
    }

    double mantissa = 0.0;
    // This exponent is base 2 rather than 10.
    // However the exponent we parse is supposed to be one of ten,
    // thus we must take care to convert the exponent/and or the
    // mantissa to a * 2^E, where a is the mantissa and E is the
    // exponent.
    // To get the final double we will use ldexp, it requires the
    // exponent to be in base 2.
    int exponent = 0;

    // NOTE: THESE MUST BE DECLARED HERE SINCE WE ARE NOT ALLOWED
    // TO JUMP OVER DEFINITIONS.
    char sign = '+';
    char exp_sign = '+';
    char const *curr = s;

    // How many characters were read in a loop.
    int read = 0;
    // Tells whether a loop terminated due to reaching s_end.
    bool end_not_reached = false;
    bool leading_decimal_dots = false;

    /*
            BEGIN PARSING.
    */

    // Find out what sign we've got.
    if (*curr == '+' || *curr == '-') {
      sign = *curr;
      curr++;
      if ((curr != s_end) && (*curr == '.')) {
        // accept. Somethig like `.7e+2`, `-.5234`
        leading_decimal_dots = true;
      }
    } else if (is_digit(*curr)) { /* Pass through. */
    } else if (*curr == '.') {
      // accept. Somethig like `.7e+2`, `-.5234`
      leading_decimal_dots = true;
    } else {
      goto fail;
    }

    // Read the integer part.
    end_not_reached = (curr != s_end);
    if (!leading_decimal_dots) {
      while (end_not_reached && is_digit(*curr)) {
        mantissa *= 10;
        mantissa += static_cast<int>(*curr - 0x30);
        curr++;
        read++;
        end_not_reached = (curr != s_end);
      }

      // We must make sure we actually got something.
      if (read == 0) goto fail;
    }

    // We allow numbers of form "#", "###" etc.
    if (!end_not_reached) goto assemble;

    // Read the decimal part.
    if (*curr == '.') {
      curr++;
      read = 1;
      end_not_reached = (curr != s_end);
      while (end_not_reached && is_digit(*curr)) {
        static const double pow_lut[] = {
                1.0, 0.1, 0.01, 0.001, 0.0001, 0.00001, 0.000001, 0.0000001,
        };
        const int lut_entries = sizeof pow_lut / sizeof pow_lut[0];

        // NOTE: Don't use powf here, it will absolutely murder precision.
        mantissa += static_cast<int>(*curr - 0x30) *
                    (read < lut_entries ? pow_lut[read] : std::pow(10.0, -read));
        read++;
        curr++;
        end_not_reached = (curr != s_end);
      }
    } else if (*curr == 'e' || *curr == 'E') {
    } else {
      goto assemble;
    }

    if (!end_not_reached) goto assemble;

    // Read the exponent part.
    if (*curr == 'e' || *curr == 'E') {
      curr++;
      // Figure out if a sign is present and if it is.
      end_not_reached = (curr != s_end);
      if (end_not_reached && (*curr == '+' || *curr == '-')) {
        exp_sign = *curr;
        curr++;
      } else if (is_digit(*curr)) { /* Pass through. */
      } else {
        // Empty E is not allowed.
        goto fail;
      }

      read = 0;
      end_not_reached = (curr != s_end);
      while (end_not_reached && is_digit(*curr)) {
        exponent *= 10;
        exponent += static_cast<int>(*curr - 0x30);
        curr++;
        read++;
        end_not_reached = (curr != s_end);
      }
      exponent *= (exp_sign == '+' ? 1 : -1);
      if (read == 0) goto fail;
    }

    assemble:
    *result = (sign == '+' ? 1 : -1) *
              (exponent ? std::ldexp(mantissa * std::pow(5.0, exponent), exponent)
                        : mantissa);
    return true;
    fail:
    return false;
  }